

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void * vector_get(Vector *vector,size_t index)

{
  ulong in_RSI;
  Vector *in_RDI;
  void *local_8;
  
  if (in_RDI == (Vector *)0x0) {
    __assert_fail("vector != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/vector.c"
                  ,0xe9,"void *vector_get(Vector *, size_t)");
  }
  if (in_RSI < in_RDI->size) {
    if (in_RDI == (Vector *)0x0) {
      local_8 = (void *)0x0;
    }
    else if (in_RDI->element_size == 0) {
      local_8 = (void *)0x0;
    }
    else if (in_RSI < in_RDI->size) {
      local_8 = _vector_offset(in_RDI,in_RSI);
    }
    else {
      local_8 = (void *)0x0;
    }
    return local_8;
  }
  __assert_fail("index < vector->size",
                "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]router-trie/vector/vector.c"
                ,0xea,"void *vector_get(Vector *, size_t)");
}

Assistant:

void* vector_get(Vector* vector, size_t index) {
	assert(vector != NULL);
	assert(index < vector->size);

	if (vector == NULL) return NULL;
	if (vector->element_size == 0) return NULL;
	if (index >= vector->size) return NULL;

	return _vector_offset(vector, index);
}